

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goeslrit.cc
# Opt level: O0

bool filter(Options *opts,
           unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *spdu)

{
  ostream *poVar1;
  runtime_error *this;
  long in_RDI;
  stringstream ss;
  NOAALRITHeader nlh;
  PrimaryHeader ph;
  SessionPDU *in_stack_fffffffffffffdf0;
  string local_1f8 [48];
  stringstream local_1c8 [16];
  ostream local_1b8 [376];
  NOAALRITHeader local_40;
  uchar local_2c;
  long local_10;
  bool local_1;
  
  local_10 = in_RDI;
  std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::operator->
            ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             0x12de94);
  assembler::SessionPDU::getHeader<lrit::PrimaryHeader>(in_stack_fffffffffffffdf0);
  std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::operator->
            ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             0x12deb1);
  local_40 = assembler::SessionPDU::getHeader<lrit::NOAALRITHeader>((SessionPDU *)0x12deb9);
  if (local_2c == '\0') {
    local_1 = (bool)((*(byte *)(local_10 + 0x90) ^ 0xff) & 1);
  }
  else if (local_2c == '\x01') {
    local_1 = (bool)((*(byte *)(local_10 + 0x91) ^ 0xff) & 1);
  }
  else if (local_2c == '\x02') {
    if ((local_40.productID == 6) || (local_40.productID == 9)) {
      local_1 = (bool)((*(byte *)(local_10 + 0x94) ^ 0xff) & 1);
    }
    else {
      local_1 = (bool)((*(byte *)(local_10 + 0x92) ^ 0xff) & 1);
    }
  }
  else {
    if (local_2c != 0x82) {
      std::__cxx11::stringstream::stringstream(local_1c8);
      poVar1 = std::operator<<(local_1b8,"Invalid file type: ");
      std::operator<<(poVar1,local_2c);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this,local_1f8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1 = (bool)((*(byte *)(local_10 + 0x93) ^ 0xff) & 1);
  }
  return local_1;
}

Assistant:

bool filter(const Options& opts, std::unique_ptr<assembler::SessionPDU>& spdu) {
  // Per http://www.noaasis.noaa.gov/LRIT/pdf-files/LRIT_receiver-specs.pdf,
  // Table 4, every file has a NOAA LRIT header.
  auto ph = spdu->getHeader<lrit::PrimaryHeader>();
  auto nlh = spdu->getHeader<lrit::NOAALRITHeader>();
  if (ph.fileType == 0) {
    return !opts.images;
  }
  if (ph.fileType == 1) {
    return !opts.messages;
  }
  if (ph.fileType == 2) {
    // This may be an EMWIN file.
    if (nlh.productID == 6 || nlh.productID == 9) {
      return !opts.emwin;
    }
    return !opts.text;
  }
  if (ph.fileType == 130) {
    return !opts.dcs;
  }

  std::stringstream ss;
  ss << "Invalid file type: " << ph.fileType;
  throw std::runtime_error(ss.str());
}